

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O3

int __thiscall HydEngine::solve(HydEngine *this,int *t)

{
  Network *pNVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  SystemError *this_00;
  int seconds;
  undefined1 local_48 [8];
  int trials;
  undefined1 local_38 [16];
  
  iVar4 = 0;
  if (this->engineState == INITIALIZED) {
    pNVar1 = this->network;
    if ((pNVar1->options).indexOptions[0xd] != 0) {
      cVar2 = (char)pNVar1 + -0x10;
      std::ios::widen((char)*(undefined8 *)(*(long *)&pNVar1->msgLog + -0x18) + cVar2);
      std::ostream::put(cVar2);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Hour ",7);
      Utilities::getTime_abi_cxx11_
                ((string *)local_48,(Utilities *)(ulong)(uint)this->currentTime,seconds);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)CONCAT44(local_48._4_4_,local_48._0_4_),_trials);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(this->timeStepReason)._M_dataplus._M_p,
                 (this->timeStepReason)._M_string_length);
      if ((undefined1 *)CONCAT44(local_48._4_4_,local_48._0_4_) != local_38) {
        operator_delete((undefined1 *)CONCAT44(local_48._4_4_,local_48._0_4_));
      }
    }
    iVar4 = this->currentTime;
    *t = iVar4;
    this->timeOfDay = (iVar4 + this->startTime) % 0x15180;
    updateCurrentConditions(this);
    local_48._0_4_ = 0;
    iVar4 = (*this->hydSolver->_vptr_HydSolver[2])((double)this->hydStep);
    if (iVar4 == 0) {
      bVar3 = isPressureDeficient(this);
      iVar4 = 0;
      if (bVar3) {
        iVar4 = resolvePressureDeficiency(this,(int *)local_48);
      }
    }
    reportDiagnostics(this,iVar4,local_48._0_4_);
    if (this->halted == true) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,9);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
  }
  return iVar4;
}

Assistant:

int  HydEngine::solve(int* t)
{
    if ( engineState != HydEngine::INITIALIZED ) return 0;
    if ( network->option(Options::REPORT_STATUS) )
    {
        network->msgLog << endl << "  Hour " <<
            Utilities::getTime(currentTime) << timeStepReason;
    }

    *t = currentTime;
    timeOfDay = (currentTime + startTime) % 86400;
    updateCurrentConditions();

    //if ( network->option(Options::REPORT_TRIALS) )  network->msgLog << endl;
    int trials = 0;
    int statusCode = hydSolver->solve(hydStep, trials);

    if ( statusCode == HydSolver::SUCCESSFUL && isPressureDeficient() )
    {
        statusCode = resolvePressureDeficiency(trials);
    }
    reportDiagnostics(statusCode, trials);
    if ( halted ) throw SystemError(SystemError::HYDRAULICS_SOLVER_FAILURE);
    return statusCode;
}